

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_FourQuads_Test::TEST_DoublingFactorCounterTest_FourQuads_Test
          (TEST_DoublingFactorCounterTest_FourQuads_Test *this)

{
  TEST_DoublingFactorCounterTest_FourQuads_Test *this_local;
  
  memset(this,0,0xc0);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest);
  (this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_DoublingFactorCounterTest_FourQuads_Test_00252a30;
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, FourQuads)
{
	addPair(Tile::WestWind);
	addQuad(Tile::ThreeOfCharacters, false);
	addQuad(Tile::FourOfCircles, true);
	addQuad(Tile::FiveOfBamboos, true);
	addQuad(Tile::SevenOfCharacters, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::FourQuads));
	CHECK_EQUAL(100, r.doubling_factor);
}